

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uv__io_uring_sqe * uv__iou_get_sqe(uv__iou *iou,uv_loop_t *loop,uv_fs_t *req)

{
  uv__queue *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long lVar4;
  
  if (iou->ringfd != -1) {
    if (((*iou->sqtail + 1 ^ *iou->sqhead) & iou->sqmask) != 0) {
      pvVar3 = iou->sqe;
      lVar4 = (ulong)(iou->sqmask & *iou->sqtail) * 0x40;
      puVar2 = (undefined8 *)((long)pvVar3 + lVar4 + 0x20);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)pvVar3 + lVar4 + 0x30);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)pvVar3 + lVar4 + 0x10);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)pvVar3 + lVar4) = 0;
      ((undefined8 *)((long)pvVar3 + lVar4))[1] = 0;
      *(uv_fs_t **)((long)pvVar3 + lVar4 + 0x20) = req;
      (req->work_req).loop = loop;
      puVar1 = &(req->work_req).wq;
      (req->work_req).work = (_func_void_uv__work_ptr *)0x0;
      (req->work_req).done = (_func_void_uv__work_ptr_int *)0x0;
      (req->work_req).wq.next = puVar1;
      (req->work_req).wq.prev = puVar1;
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      iou->in_flight = iou->in_flight + 1;
      return (uv__io_uring_sqe *)(lVar4 + (long)pvVar3);
    }
  }
  return (uv__io_uring_sqe *)0x0;
}

Assistant:

static struct uv__io_uring_sqe* uv__iou_get_sqe(struct uv__iou* iou,
                                                uv_loop_t* loop,
                                                uv_fs_t* req) {
  struct uv__io_uring_sqe* sqe;
  uint32_t head;
  uint32_t tail;
  uint32_t mask;
  uint32_t slot;

  if (iou->ringfd == -1)
    return NULL;

  head = atomic_load_explicit((_Atomic uint32_t*) iou->sqhead,
                              memory_order_acquire);
  tail = *iou->sqtail;
  mask = iou->sqmask;

  if ((head & mask) == ((tail + 1) & mask))
    return NULL;  /* No room in ring buffer. TODO(bnoordhuis) maybe flush it? */

  slot = tail & mask;
  sqe = iou->sqe;
  sqe = &sqe[slot];
  memset(sqe, 0, sizeof(*sqe));
  sqe->user_data = (uintptr_t) req;

  /* Pacify uv_cancel(). */
  req->work_req.loop = loop;
  req->work_req.work = NULL;
  req->work_req.done = NULL;
  uv__queue_init(&req->work_req.wq);

  uv__req_register(loop, req);
  iou->in_flight++;

  return sqe;
}